

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode
          (ExclusiveJoinPromiseNode *this,OwnPromiseNode *left,OwnPromiseNode *right,
          SourceLocation location)

{
  OwnPromiseNode OVar1;
  OwnPromiseNode local_28;
  OwnPromiseNode local_20;
  
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR_destroy_0038b028;
  local_20 = (OwnPromiseNode)left->ptr;
  left->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->left,this,&local_20,location);
  OVar1.ptr = local_20.ptr;
  if (&(local_20.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_20.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
  }
  local_28 = (OwnPromiseNode)right->ptr;
  right->ptr = (PromiseNode *)0x0;
  Branch::Branch(&this->right,this,&local_28,location);
  OVar1.ptr = local_28.ptr;
  if (&(local_28.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
    local_28.ptr = (PromiseNode *)0x0;
    PromiseDisposer::dispose(&(OVar1.ptr)->super_PromiseArenaMember);
  }
  (this->onReadyEvent).event = (Event *)0x0;
  return;
}

Assistant:

ExclusiveJoinPromiseNode::ExclusiveJoinPromiseNode(
    OwnPromiseNode left, OwnPromiseNode right, SourceLocation location)
    : left(*this, kj::mv(left), location), right(*this, kj::mv(right), location) {}